

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void reallymarkobject(global_State *g,GCObject *o)

{
  GCObject *o_00;
  UpVal *uv;
  Table *mt;
  GCObject *o_local;
  global_State *g_local;
  
  (o->gch).marked = (o->gch).marked & 0xfc;
  switch((o->gch).tt) {
  case '\x04':
    break;
  case '\x05':
    (o->h).gclist = g->gray;
    g->gray = o;
    break;
  case '\x06':
    (o->h).metatable = (Table *)g->gray;
    g->gray = o;
    break;
  case '\a':
    o_00 = (GCObject *)(o->h).metatable;
    (o->gch).marked = (o->gch).marked | 4;
    if ((o_00 != (GCObject *)0x0) && (((o_00->gch).marked & 3) != 0)) {
      reallymarkobject(g,o_00);
    }
    if ((((o->h).array)->tt & 0x300) != 0) {
      reallymarkobject(g,(GCObject *)(o->h).array);
    }
    break;
  case '\b':
    (o->th).gclist = g->gray;
    g->gray = o;
    break;
  case '\t':
    (o->p).gclist = g->gray;
    g->gray = o;
    break;
  case '\n':
    if ((3 < ((o->p).k)->tt) && (((((o->h).metatable)->next->gch).marked & 3) != 0)) {
      reallymarkobject(g,((o->h).metatable)->next);
    }
    if ((o->h).metatable == (Table *)&(o->h).array) {
      (o->gch).marked = (o->gch).marked | 4;
    }
  }
  return;
}

Assistant:

static void reallymarkobject(global_State*g,GCObject*o){
white2gray(o);
switch(o->gch.tt){
case 4:{
return;
}
case 7:{
Table*mt=gco2u(o)->metatable;
gray2black(o);
if(mt)markobject(g,mt);
markobject(g,gco2u(o)->env);
return;
}
case(8+2):{
UpVal*uv=gco2uv(o);
markvalue(g,uv->v);
if(uv->v==&uv->u.value)
gray2black(o);
return;
}
case 6:{
gco2cl(o)->c.gclist=g->gray;
g->gray=o;
break;
}
case 5:{
gco2h(o)->gclist=g->gray;
g->gray=o;
break;
}
case 8:{
gco2th(o)->gclist=g->gray;
g->gray=o;
break;
}
case(8+1):{
gco2p(o)->gclist=g->gray;
g->gray=o;
break;
}
default:;
}
}